

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

size_t __thiscall PicHeader::binSize(PicHeader *this)

{
  if (this->isSwitch == true) {
    return (long)(this->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                 super__Vector_impl_data._M_finish +
           ((ulong)(2 < this->version) * 4 -
           (long)(this->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                 super__Vector_impl_data._M_start) + 0x20;
  }
  return (((long)(this->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(this->chunks).super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                super__Vector_impl_data._M_start) / 0xc) * 8 + 0x18;
}

Assistant:

size_t PicHeader::binSize() const {
	if (isSwitch) {
		return picBinSize<PicHeaderSwitch>(this);
	} else {
		return picBinSize<PicHeaderPS3>(this);
	}
}